

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

void sqlcheck::CheckFloat(Configuration *state,string *sql_statement,bool *print_statement)

{
  char *pcVar1;
  allocator local_c1;
  string local_c0;
  string local_a0;
  char *local_80;
  char *message;
  PatternType pattern_type;
  allocator local_61;
  string local_60 [8];
  string title;
  regex pattern;
  bool *print_statement_local;
  string *sql_statement_local;
  Configuration *state_local;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8),
             "(float)|(real)|(double precision)|(0\\.000[0-9]*)",0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"Imprecise Data Type",&local_61);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  message._0_4_ = 1;
  local_80 = anon_var_dwarf_5a75e;
  std::__cxx11::string::string((string *)&local_a0,local_60);
  pcVar1 = local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,pcVar1,&local_c1);
  CheckPattern(state,sql_statement,print_statement,(regex *)((long)&title.field_2 + 8),
               RISK_LEVEL_MEDIUM,PATTERN_TYPE_PHYSICAL_DATABASE_DESIGN,&local_a0,&local_c0,true,0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8));
  return;
}

Assistant:

void CheckFloat(Configuration& state,
                const std::string& sql_statement,
                bool& print_statement){

  std::regex pattern("(float)|(real)|(double precision)|(0\\.000[0-9]*)");
  std::string title = "Imprecise Data Type";
  PatternType pattern_type = PatternType::PATTERN_TYPE_PHYSICAL_DATABASE_DESIGN;

  auto message =
      "● Use precise data types:  "
      "Virtually any use of FLOAT, REAL, or DOUBLE PRECISION data types is suspect. "
      "Most applications that use floating-point numbers don't require the range of "
      "values supported by IEEE 754 formats. The cumulative impact of inexact  "
      "floating-point numbers is severe when calculating aggregates. "
      "Instead of FLOAT or its siblings, use the NUMERIC or DECIMAL SQL data types "
      "for fixed-precision fractional numbers. These data types store numeric values "
      "exactly, up to the precision you specify in the column definition. "
      "Do not use FLOAT if you can avoid it.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_MEDIUM,
               pattern_type,
               title,
               message,
               true);

}